

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XMLUri.cpp
# Opt level: O0

void __thiscall xercesc_4_0::XMLUri::initialize(XMLUri *this,XMLUri *baseURI,XMLCh *uriSpec)

{
  long lVar1;
  short sVar2;
  MemoryManager *pMVar3;
  MemoryManager *pMVar4;
  bool bVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  XMLSize_t XVar10;
  MalformedURLException *pMVar11;
  undefined4 extraout_var;
  ulong startIndex;
  undefined4 extraout_var_00;
  XMLCh *pXVar12;
  XMLSize_t XVar13;
  XMLSize_t XVar14;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  int local_2ec;
  int local_128;
  int offset;
  int segIndex;
  int iIndex;
  int lastSlash;
  ArrayJanitor<char16_t> tmp2Name;
  XMLCh *tmp2;
  ArrayJanitor<char16_t> tmp1Name;
  XMLCh *tmp1;
  ArrayJanitor<char16_t> pathName;
  XMLCh *path;
  XMLSize_t bufLen;
  ArrayJanitor<char16_t> basePathName;
  XMLCh *basePath;
  ArrayJanitor<char16_t> pathUriSpecName;
  XMLCh *pathUriSpec;
  XMLCh testChar;
  XMLSize_t startPos;
  ArrayJanitor<char16_t> authName;
  XMLCh *authUriSpec;
  int fragmentIdx;
  int queryIdx;
  int slashIdx;
  int colonIdx;
  bool foundScheme;
  XMLSize_t index;
  XMLSize_t trimmedUriSpecLen;
  ArrayJanitor<char16_t> janName;
  XMLCh *trimmedUriSpec;
  XMLCh *uriSpec_local;
  XMLUri *baseURI_local;
  XMLUri *this_local;
  
  janName.fMemoryManager = (MemoryManager *)XMLString::replicate(uriSpec,this->fMemoryManager);
  XMLString::trim((XMLCh *)janName.fMemoryManager);
  ArrayJanitor<char16_t>::ArrayJanitor
            ((ArrayJanitor<char16_t> *)&trimmedUriSpecLen,(char16_t *)janName.fMemoryManager,
             this->fMemoryManager);
  XVar10 = XMLString::stringLen((XMLCh *)janName.fMemoryManager);
  if ((baseURI == (XMLUri *)0x0) &&
     ((janName.fMemoryManager == (MemoryManager *)0x0 || (XVar10 == 0)))) {
    pMVar11 = (MalformedURLException *)__cxa_allocate_exception(0x30);
    MalformedURLException::MalformedURLException
              (pMVar11,
               "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/util/XMLUri.cpp"
               ,0x191,XMLNUM_URI_Component_Empty,(XMLCh *)errMsg_PARAMS,(XMLCh *)0x0,(XMLCh *)0x0,
               (XMLCh *)0x0,this->fMemoryManager);
    __cxa_throw(pMVar11,&MalformedURLException::typeinfo,
                MalformedURLException::~MalformedURLException);
  }
  if ((janName.fMemoryManager == (MemoryManager *)0x0) || (XVar10 == 0)) {
    initialize(this,baseURI);
  }
  else {
    _colonIdx = 0;
    bVar5 = false;
    iVar6 = XMLString::indexOf((XMLCh *)janName.fMemoryManager,L':');
    iVar7 = XMLString::indexOf((XMLCh *)janName.fMemoryManager,L'/');
    iVar8 = XMLString::indexOf((XMLCh *)janName.fMemoryManager,L'?');
    iVar9 = XMLString::indexOf((XMLCh *)janName.fMemoryManager,L'#');
    if (((iVar6 < 1) || ((iVar7 < iVar6 && (iVar7 != -1)))) ||
       (((iVar8 < iVar6 && (iVar8 != -1)) || ((iVar9 < iVar6 && (iVar9 != -1)))))) {
      if ((iVar6 == 0) || ((baseURI == (XMLUri *)0x0 && (iVar9 != 0)))) {
        pMVar11 = (MalformedURLException *)__cxa_allocate_exception(0x30);
        MalformedURLException::MalformedURLException
                  (pMVar11,
                   "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/util/XMLUri.cpp"
                   ,0x1ac,XMLNUM_URI_No_Scheme,this->fMemoryManager);
        __cxa_throw(pMVar11,&MalformedURLException::typeinfo,
                    MalformedURLException::~MalformedURLException);
      }
    }
    else {
      bVar5 = true;
      initializeScheme(this,(XMLCh *)janName.fMemoryManager);
      XVar13 = XMLString::stringLen(this->fScheme);
      _colonIdx = XVar13 + 1;
    }
    if ((_colonIdx == XVar10) ||
       ((bVar5 && (*(short *)((long)&(janName.fMemoryManager)->_vptr_MemoryManager + _colonIdx * 2)
                   == 0x23)))) {
      pMVar11 = (MalformedURLException *)__cxa_allocate_exception(0x30);
      MalformedURLException::MalformedURLException
                (pMVar11,
                 "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/util/XMLUri.cpp"
                 ,0x1bc,XMLNUM_URI_Component_Empty,(XMLCh *)errMsg_PATH,(XMLCh *)0x0,(XMLCh *)0x0,
                 (XMLCh *)0x0,this->fMemoryManager);
      __cxa_throw(pMVar11,&MalformedURLException::typeinfo,
                  MalformedURLException::~MalformedURLException);
    }
    iVar6 = (*this->fMemoryManager->_vptr_MemoryManager[3])(this->fMemoryManager,XVar10 * 2 + 2);
    authName.fMemoryManager = (MemoryManager *)CONCAT44(extraout_var,iVar6);
    ArrayJanitor<char16_t>::ArrayJanitor
              ((ArrayJanitor<char16_t> *)&startPos,(char16_t *)authName.fMemoryManager,
               this->fMemoryManager);
    XMLString::subString
              ((XMLCh *)authName.fMemoryManager,(XMLCh *)janName.fMemoryManager,_colonIdx,XVar10,
               this->fMemoryManager);
    if ((_colonIdx + 1 < XVar10) &&
       (bVar5 = XMLString::startsWith((XMLCh *)authName.fMemoryManager,L"//"), bVar5)) {
      startIndex = _colonIdx + 2;
      for (_colonIdx = startIndex;
          (((_colonIdx < XVar10 &&
            (sVar2 = *(short *)((long)&(janName.fMemoryManager)->_vptr_MemoryManager + _colonIdx * 2
                               ), sVar2 != 0x2f)) && (sVar2 != 0x3f)) && (sVar2 != 0x23));
          _colonIdx = _colonIdx + 1) {
      }
      if (startIndex < _colonIdx) {
        XMLString::subString
                  ((XMLCh *)authName.fMemoryManager,(XMLCh *)janName.fMemoryManager,startIndex,
                   _colonIdx,this->fMemoryManager);
        initializeAuthority(this,(XMLCh *)authName.fMemoryManager);
      }
      else {
        setHost(this,L"");
      }
    }
    if (_colonIdx < XVar10) {
      iVar6 = (*this->fMemoryManager->_vptr_MemoryManager[3])(this->fMemoryManager,XVar10 * 2 + 2);
      pathUriSpecName.fMemoryManager = (MemoryManager *)CONCAT44(extraout_var_00,iVar6);
      ArrayJanitor<char16_t>::ArrayJanitor
                ((ArrayJanitor<char16_t> *)&basePath,(char16_t *)pathUriSpecName.fMemoryManager,
                 this->fMemoryManager);
      XMLString::subString
                ((XMLCh *)pathUriSpecName.fMemoryManager,(XMLCh *)janName.fMemoryManager,_colonIdx,
                 XVar10,this->fMemoryManager);
      initializePath(this,(XMLCh *)pathUriSpecName.fMemoryManager);
      if (baseURI != (XMLUri *)0x0) {
        if (((this->fPath == (XMLCh *)0x0) || (*this->fPath == L'\0')) &&
           ((this->fScheme == (XMLCh *)0x0 &&
            ((this->fHost == (XMLCh *)0x0 && (this->fRegAuth == (XMLCh *)0x0)))))) {
          pXVar12 = getScheme(baseURI);
          pXVar12 = XMLString::replicate(pXVar12,this->fMemoryManager);
          this->fScheme = pXVar12;
          (*this->fMemoryManager->_vptr_MemoryManager[4])(this->fMemoryManager,this->fUserInfo);
          pXVar12 = getUserInfo(baseURI);
          pXVar12 = XMLString::replicate(pXVar12,this->fMemoryManager);
          this->fUserInfo = pXVar12;
          pXVar12 = getHost(baseURI);
          pXVar12 = XMLString::replicate(pXVar12,this->fMemoryManager);
          this->fHost = pXVar12;
          iVar6 = getPort(baseURI);
          this->fPort = iVar6;
          pXVar12 = getRegBasedAuthority(baseURI);
          pXVar12 = XMLString::replicate(pXVar12,this->fMemoryManager);
          this->fRegAuth = pXVar12;
          (*this->fMemoryManager->_vptr_MemoryManager[4])(this->fMemoryManager,this->fPath);
          pXVar12 = getPath(baseURI);
          pXVar12 = XMLString::replicate(pXVar12,this->fMemoryManager);
          this->fPath = pXVar12;
          if (this->fQueryString == (XMLCh *)0x0) {
            pXVar12 = getQueryString(baseURI);
            pXVar12 = XMLString::replicate(pXVar12,this->fMemoryManager);
            this->fQueryString = pXVar12;
          }
        }
        else if (this->fScheme == (XMLCh *)0x0) {
          pXVar12 = getScheme(baseURI);
          pXVar12 = XMLString::replicate(pXVar12,this->fMemoryManager);
          this->fScheme = pXVar12;
          if ((this->fHost == (XMLCh *)0x0) && (this->fRegAuth == (XMLCh *)0x0)) {
            (*this->fMemoryManager->_vptr_MemoryManager[4])(this->fMemoryManager,this->fUserInfo);
            pXVar12 = getUserInfo(baseURI);
            pXVar12 = XMLString::replicate(pXVar12,this->fMemoryManager);
            this->fUserInfo = pXVar12;
            pXVar12 = getHost(baseURI);
            pXVar12 = XMLString::replicate(pXVar12,this->fMemoryManager);
            this->fHost = pXVar12;
            iVar6 = getPort(baseURI);
            this->fPort = iVar6;
            pXVar12 = getRegBasedAuthority(baseURI);
            pXVar12 = XMLString::replicate(pXVar12,this->fMemoryManager);
            this->fRegAuth = pXVar12;
            if ((this->fPath == (XMLCh *)0x0) ||
               ((*this->fPath == L'\0' || (bVar5 = XMLString::startsWith(this->fPath,L"/"), !bVar5))
               )) {
              pXVar12 = getPath(baseURI);
              basePathName.fMemoryManager =
                   (MemoryManager *)XMLString::replicate(pXVar12,this->fMemoryManager);
              ArrayJanitor<char16_t>::ArrayJanitor
                        ((ArrayJanitor<char16_t> *)&bufLen,(char16_t *)basePathName.fMemoryManager,
                         this->fMemoryManager);
              XVar13 = XMLString::stringLen(this->fPath);
              XVar14 = XMLString::stringLen((XMLCh *)basePathName.fMemoryManager);
              lVar1 = XVar10 + XVar13 + 1 + XVar14;
              iVar6 = (*this->fMemoryManager->_vptr_MemoryManager[3])
                                (this->fMemoryManager,lVar1 * 2);
              pathName.fMemoryManager = (MemoryManager *)CONCAT44(extraout_var_01,iVar6);
              ArrayJanitor<char16_t>::ArrayJanitor
                        ((ArrayJanitor<char16_t> *)&tmp1,(char16_t *)pathName.fMemoryManager,
                         this->fMemoryManager);
              *(undefined2 *)&(pathName.fMemoryManager)->_vptr_MemoryManager = 0;
              iVar6 = (*this->fMemoryManager->_vptr_MemoryManager[3])
                                (this->fMemoryManager,lVar1 * 2);
              tmp1Name.fMemoryManager = (MemoryManager *)CONCAT44(extraout_var_02,iVar6);
              ArrayJanitor<char16_t>::ArrayJanitor
                        ((ArrayJanitor<char16_t> *)&tmp2,(char16_t *)tmp1Name.fMemoryManager,
                         this->fMemoryManager);
              iVar6 = (*this->fMemoryManager->_vptr_MemoryManager[3])
                                (this->fMemoryManager,lVar1 * 2);
              tmp2Name.fMemoryManager = (MemoryManager *)CONCAT44(extraout_var_03,iVar6);
              ArrayJanitor<char16_t>::ArrayJanitor
                        ((ArrayJanitor<char16_t> *)&iIndex,(char16_t *)tmp2Name.fMemoryManager,
                         this->fMemoryManager);
              if ((basePathName.fMemoryManager != (MemoryManager *)0x0) &&
                 (iVar6 = XMLString::lastIndexOf((XMLCh *)basePathName.fMemoryManager,L'/'),
                 iVar6 != -1)) {
                XMLString::subString
                          ((XMLCh *)pathName.fMemoryManager,(XMLCh *)basePathName.fMemoryManager,0,
                           (long)(iVar6 + 1),this->fMemoryManager);
              }
              XMLString::catString((XMLCh *)pathName.fMemoryManager,this->fPath);
              while (iVar6 = XMLString::patternMatch((XMLCh *)pathName.fMemoryManager,L"/./"),
                    iVar6 != -1) {
                XMLString::subString
                          ((XMLCh *)tmp1Name.fMemoryManager,(XMLCh *)pathName.fMemoryManager,0,
                           (long)iVar6,this->fMemoryManager);
                pMVar4 = pathName.fMemoryManager;
                pMVar3 = tmp2Name.fMemoryManager;
                XVar10 = XMLString::stringLen((XMLCh *)pathName.fMemoryManager);
                XMLString::subString
                          ((XMLCh *)pMVar3,(XMLCh *)pMVar4,(long)(iVar6 + 2),XVar10,
                           this->fMemoryManager);
                *(undefined2 *)&(pathName.fMemoryManager)->_vptr_MemoryManager = 0;
                XMLString::catString
                          ((XMLCh *)pathName.fMemoryManager,(XMLCh *)tmp1Name.fMemoryManager);
                XMLString::catString
                          ((XMLCh *)pathName.fMemoryManager,(XMLCh *)tmp2Name.fMemoryManager);
              }
              bVar5 = XMLString::endsWith((XMLCh *)pathName.fMemoryManager,L"/.");
              pMVar3 = pathName.fMemoryManager;
              if (bVar5) {
                XVar10 = XMLString::stringLen((XMLCh *)pathName.fMemoryManager);
                *(undefined2 *)((long)pMVar3 + (XVar10 - 1) * 2) = 0;
              }
              local_128 = 1;
              while (iVar6 = XMLString::patternMatch
                                       ((XMLCh *)((long)&(pathName.fMemoryManager)->
                                                         _vptr_MemoryManager + (long)local_128 * 2),
                                        (XMLCh *)SLASH_DOTDOT_SLASH), iVar6 != -1) {
                iVar6 = iVar6 + local_128;
                XMLString::subString
                          ((XMLCh *)tmp1Name.fMemoryManager,(XMLCh *)pathName.fMemoryManager,0,
                           (long)(iVar6 + -1),this->fMemoryManager);
                local_2ec = XMLString::lastIndexOf((XMLCh *)tmp1Name.fMemoryManager,L'/');
                if ((local_2ec == -1) ||
                   (((*(short *)((long)&(pathName.fMemoryManager)->_vptr_MemoryManager +
                                (long)(local_2ec + 1) * 2) == 0x2e &&
                     (*(short *)((long)&(pathName.fMemoryManager)->_vptr_MemoryManager +
                                (long)(local_2ec + 2) * 2) == 0x2e)) && (local_2ec + 3 == iVar6))))
                {
                  local_128 = local_128 + 4;
                }
                else {
                  XMLString::subString
                            ((XMLCh *)tmp1Name.fMemoryManager,(XMLCh *)pathName.fMemoryManager,0,
                             (long)local_2ec,this->fMemoryManager);
                  pMVar4 = pathName.fMemoryManager;
                  pMVar3 = tmp2Name.fMemoryManager;
                  XVar10 = XMLString::stringLen((XMLCh *)pathName.fMemoryManager);
                  XMLString::subString
                            ((XMLCh *)pMVar3,(XMLCh *)pMVar4,(long)(iVar6 + 3),XVar10,
                             this->fMemoryManager);
                  *(undefined2 *)&(pathName.fMemoryManager)->_vptr_MemoryManager = 0;
                  XMLString::catString
                            ((XMLCh *)pathName.fMemoryManager,(XMLCh *)tmp1Name.fMemoryManager);
                  XMLString::catString
                            ((XMLCh *)pathName.fMemoryManager,(XMLCh *)tmp2Name.fMemoryManager);
                  if (local_2ec == 0) {
                    local_2ec = 1;
                  }
                  local_128 = local_2ec;
                }
              }
              bVar5 = XMLString::endsWith((XMLCh *)pathName.fMemoryManager,L"/..");
              if (bVar5) {
                XVar10 = XMLString::stringLen((XMLCh *)pathName.fMemoryManager);
                XMLString::subString
                          ((XMLCh *)tmp1Name.fMemoryManager,(XMLCh *)pathName.fMemoryManager,0,
                           XVar10 - 4,this->fMemoryManager);
                iVar6 = XMLString::lastIndexOf((XMLCh *)tmp1Name.fMemoryManager,L'/');
                if ((iVar6 != -1) &&
                   (((*(short *)((long)&(pathName.fMemoryManager)->_vptr_MemoryManager +
                                (long)(iVar6 + 1) * 2) != 0x2e ||
                     (*(short *)((long)&(pathName.fMemoryManager)->_vptr_MemoryManager +
                                (long)(iVar6 + 2) * 2) != 0x2e)) || (iVar6 + 3 != (int)XVar10 + -3))
                   )) {
                  *(undefined2 *)
                   ((long)&(pathName.fMemoryManager)->_vptr_MemoryManager + (long)(iVar6 + 1) * 2) =
                       0;
                }
              }
              pXVar12 = getPath(this);
              if (pXVar12 != (XMLCh *)0x0) {
                (*this->fMemoryManager->_vptr_MemoryManager[4])(this->fMemoryManager,this->fPath);
              }
              pXVar12 = XMLString::replicate((XMLCh *)pathName.fMemoryManager,this->fMemoryManager);
              this->fPath = pXVar12;
              ArrayJanitor<char16_t>::~ArrayJanitor((ArrayJanitor<char16_t> *)&iIndex);
              ArrayJanitor<char16_t>::~ArrayJanitor((ArrayJanitor<char16_t> *)&tmp2);
              ArrayJanitor<char16_t>::~ArrayJanitor((ArrayJanitor<char16_t> *)&tmp1);
              ArrayJanitor<char16_t>::~ArrayJanitor((ArrayJanitor<char16_t> *)&bufLen);
            }
          }
        }
      }
      ArrayJanitor<char16_t>::~ArrayJanitor((ArrayJanitor<char16_t> *)&basePath);
    }
    ArrayJanitor<char16_t>::~ArrayJanitor((ArrayJanitor<char16_t> *)&startPos);
  }
  ArrayJanitor<char16_t>::~ArrayJanitor((ArrayJanitor<char16_t> *)&trimmedUriSpecLen);
  return;
}

Assistant:

void XMLUri::initialize(const XMLUri* const baseURI
                      , const XMLCh*  const uriSpec)
{

    // get a trimmed version of uriSpec
    // uriSpec will NO LONGER be used in this function.
    //
    XMLCh* trimmedUriSpec = XMLString::replicate(uriSpec, fMemoryManager);
    XMLString::trim(trimmedUriSpec);
    ArrayJanitor<XMLCh> janName(trimmedUriSpec, fMemoryManager);
    XMLSize_t trimmedUriSpecLen = XMLString::stringLen(trimmedUriSpec);

    if ( !baseURI &&
        (!trimmedUriSpec || trimmedUriSpecLen == 0))
    {
        ThrowXMLwithMemMgr1(MalformedURLException
               , XMLExcepts::XMLNUM_URI_Component_Empty
               , errMsg_PARAMS
               , fMemoryManager);
    }

	// just make a copy of the base if spec is empty
	if (!trimmedUriSpec || trimmedUriSpecLen == 0)
    {
        initialize(*baseURI);
        return;
	}

	XMLSize_t index = 0;
	bool foundScheme = false;

	// Check for scheme, which must be before `/', '?' or '#'.
        int colonIdx = XMLString::indexOf(trimmedUriSpec, chColon);
        int slashIdx = XMLString::indexOf(trimmedUriSpec, chForwardSlash);
        int queryIdx = XMLString::indexOf(trimmedUriSpec, chQuestion);
        int fragmentIdx = XMLString::indexOf(trimmedUriSpec, chPound);

        if ((colonIdx <= 0) ||
            (colonIdx > slashIdx && slashIdx != -1) ||
            (colonIdx > queryIdx && queryIdx != -1) ||
            (colonIdx > fragmentIdx && fragmentIdx != -1))
        {
            // A standalone base is a valid URI according to spec
            if ( colonIdx == 0 || (!baseURI && fragmentIdx != 0) )
            {
                ThrowXMLwithMemMgr(MalformedURLException, XMLExcepts::XMLNUM_URI_No_Scheme, fMemoryManager);
            }
        }
        else
        {
            foundScheme = true;
            initializeScheme(trimmedUriSpec);
            index = XMLString::stringLen(fScheme)+1;
        }

    // It's an error if we stop here
    if (index == trimmedUriSpecLen || (foundScheme && (trimmedUriSpec[index] == chPound)))
    {
        ThrowXMLwithMemMgr1(MalformedURLException
                , XMLExcepts::XMLNUM_URI_Component_Empty
                , errMsg_PATH
                , fMemoryManager);
    }

	// two slashes means generic URI syntax, so we get the authority
    XMLCh* authUriSpec = (XMLCh*) fMemoryManager->allocate
    (
        (trimmedUriSpecLen+1) * sizeof(XMLCh)
    );//new XMLCh[trimmedUriSpecLen+1];
    ArrayJanitor<XMLCh> authName(authUriSpec, fMemoryManager);
    XMLString::subString(authUriSpec, trimmedUriSpec, index, trimmedUriSpecLen, fMemoryManager);

    if (((index+1) < trimmedUriSpecLen) &&
        XMLString::startsWith(authUriSpec, DOUBLE_SLASH))
    {
        index += 2;
        XMLSize_t startPos = index;

        // get authority - everything up to path, query or fragment
        XMLCh testChar;
        while (index < trimmedUriSpecLen)
        {
            testChar = trimmedUriSpec[index];
            if (testChar == chForwardSlash ||
                testChar == chQuestion     ||
                testChar == chPound         )
            {
                break;
            }

            index++;
        }

        // if we found authority, parse it out, otherwise we set the
        // host to empty string
        if (index > startPos)
        {
            XMLString::subString(authUriSpec, trimmedUriSpec, startPos, index, fMemoryManager);
            initializeAuthority(authUriSpec);
        }
        else
        {
            //fHost = 0;
            setHost(XMLUni::fgZeroLenString);
        }
    }

    // we need to check if index has exceed the lenght or not
    if (index >= trimmedUriSpecLen)
        return;

    XMLCh* pathUriSpec = (XMLCh*) fMemoryManager->allocate
    (
        (trimmedUriSpecLen+1) * sizeof(XMLCh)
    );//new XMLCh[trimmedUriSpecLen+1];
    ArrayJanitor<XMLCh> pathUriSpecName(pathUriSpec, fMemoryManager);
    XMLString::subString(pathUriSpec, trimmedUriSpec, index, trimmedUriSpecLen, fMemoryManager);

	initializePath(pathUriSpec);

	// Resolve relative URI to base URI - see RFC 2396 Section 5.2
	// In some cases, it might make more sense to throw an exception
	// (when scheme is specified is the string spec and the base URI
	// is also specified, for example), but we're just following the
	// RFC specifications
	if ( baseURI )
    {
        // check to see if this is the current doc - RFC 2396 5.2 #2
        // note that this is slightly different from the RFC spec in that
        // we don't include the check for query string being null
        // - this handles cases where the urispec is just a query
        // string or a fragment (e.g. "?y" or "#s") -
        // see <http://www.ics.uci.edu/~fielding/url/test1.html> which
        // identified this as a bug in the RFC
        if ((!fPath || !*fPath) &&
            fScheme == 0 &&
            fHost == 0 && fRegAuth == 0)
        {
            fScheme = XMLString::replicate(baseURI->getScheme(), fMemoryManager);
            fMemoryManager->deallocate(fUserInfo);//delete [] fUserInfo;
            fUserInfo = XMLString::replicate(baseURI->getUserInfo(), fMemoryManager);
            fHost = XMLString::replicate(baseURI->getHost(), fMemoryManager);
            fPort = baseURI->getPort();
            fRegAuth = XMLString::replicate(baseURI->getRegBasedAuthority(), fMemoryManager);
            fMemoryManager->deallocate(fPath);//delete [] fPath;
            fPath = XMLString::replicate(baseURI->getPath(), fMemoryManager);

            if ( !fQueryString )
            {
                fQueryString = XMLString::replicate(baseURI->getQueryString(), fMemoryManager);
            }
            return;
        }

        // check for scheme - RFC 2396 5.2 #3
        // if we found a scheme, it means absolute URI, so we're done
        if (fScheme == 0)
        {
            fScheme = XMLString::replicate(baseURI->getScheme(), fMemoryManager);
        }
        else
        {
            return;
        }

        // check for authority - RFC 2396 5.2 #4
        // if we found a host, then we've got a network path, so we're done
        if (fHost == 0 && fRegAuth == 0)
        {
            fMemoryManager->deallocate(fUserInfo);//delete [] fUserInfo;
            fUserInfo = XMLString::replicate(baseURI->getUserInfo(), fMemoryManager);
            fHost = XMLString::replicate(baseURI->getHost(), fMemoryManager);
            fPort = baseURI->getPort();
            fRegAuth = XMLString::replicate(baseURI->getRegBasedAuthority(), fMemoryManager);
        }
        else
        {
            return;
        }

        // check for absolute path - RFC 2396 5.2 #5
        if ((fPath && *fPath) &&
            XMLString::startsWith(fPath, SINGLE_SLASH))
        {
            return;
        }

        // if we get to this point, we need to resolve relative path
        // RFC 2396 5.2 #6

        XMLCh* basePath = XMLString::replicate(baseURI->getPath(), fMemoryManager);
        ArrayJanitor<XMLCh> basePathName(basePath, fMemoryManager);

        XMLSize_t bufLen = trimmedUriSpecLen+XMLString::stringLen(fPath)+XMLString::stringLen(basePath)+1;
        XMLCh* path = (XMLCh*) fMemoryManager->allocate(bufLen * sizeof(XMLCh));//new XMLCh[bufLen];
        ArrayJanitor<XMLCh> pathName(path, fMemoryManager);
        path[0] = 0;

        XMLCh* tmp1 = (XMLCh*) fMemoryManager->allocate(bufLen * sizeof(XMLCh));//new XMLCh[bufLen];
        ArrayJanitor<XMLCh> tmp1Name(tmp1, fMemoryManager);
        XMLCh* tmp2 = (XMLCh*) fMemoryManager->allocate(bufLen * sizeof(XMLCh));//new XMLCh[bufLen];
        ArrayJanitor<XMLCh> tmp2Name(tmp2, fMemoryManager);

        // 6a - get all but the last segment of the base URI path
        if (basePath)
        {
            int lastSlash = XMLString::lastIndexOf(basePath, chForwardSlash);
            if (lastSlash != -1)
            {
                XMLString::subString(path, basePath, 0, lastSlash+1, fMemoryManager);
            }
        }

        // 6b - append the relative URI path
        XMLString::catString(path, fPath);

        // 6c - remove all "./" where "." is a complete path segment
        int iIndex = -1;
        while ((iIndex = XMLString::patternMatch(path, SLASH_DOT_SLASH)) != -1)
        {
            XMLString::subString(tmp1, path, 0, iIndex, fMemoryManager);
            XMLString::subString(tmp2, path, iIndex+2, XMLString::stringLen(path), fMemoryManager);

            path[0] = 0;
            XMLString::catString(path, tmp1);
            XMLString::catString(path, tmp2);
        }

        // 6d - remove "." if path ends with "." as a complete path segment
        if (XMLString::endsWith(path, SLASH_DOT))
        {
            path[XMLString::stringLen(path) - 1] = chNull;
        }

        // 6e - remove all "<segment>/../" where "<segment>" is a complete
        // path segment not equal to ".."
        iIndex = -1;
        int segIndex = -1;
        int offset = 1;

        while ((iIndex = XMLString::patternMatch(&(path[offset]), SLASH_DOTDOT_SLASH)) != -1)
        {
			// Undo offset
			iIndex += offset;

			// Find start of <segment> within substring ending at found point.
			XMLString::subString(tmp1, path, 0, iIndex-1, fMemoryManager);
			segIndex = XMLString::lastIndexOf(tmp1, chForwardSlash);

			// Ensure <segment> exists and != ".."
            if (segIndex != -1                &&
                (path[segIndex+1] != chPeriod ||
                 path[segIndex+2] != chPeriod ||
				 segIndex + 3 != iIndex))
            {

                XMLString::subString(tmp1, path, 0, segIndex, fMemoryManager);
                XMLString::subString(tmp2, path, iIndex+3, XMLString::stringLen(path), fMemoryManager);

                path[0] = 0;
                XMLString::catString(path, tmp1);
                XMLString::catString(path, tmp2);

                offset = (segIndex == 0 ? 1 : segIndex);
            }
            else
            {
                offset += 4;
            }
        }// while

        // 6f - remove ending "<segment>/.." where "<segment>" is a
        // complete path segment
        if (XMLString::endsWith(path, SLASH_DOTDOT))
        {
			// Find start of <segment> within substring ending at found point.
            index = XMLString::stringLen(path) - 3;
			XMLString::subString(tmp1, path, 0, index-1, fMemoryManager);
			segIndex = XMLString::lastIndexOf(tmp1, chForwardSlash);

            if (segIndex != -1                &&
                (path[segIndex+1] != chPeriod ||
                 path[segIndex+2] != chPeriod ||
				 segIndex + 3 != (int)index))
            {
                path[segIndex+1] = chNull;
            }
        }

        if (getPath())
            fMemoryManager->deallocate(fPath);//delete [] fPath;

        fPath = XMLString::replicate(path, fMemoryManager);

    }
}